

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMReader.cpp
# Opt level: O0

Barcode * __thiscall ZXing::DataMatrix::Reader::decode(Reader *this,BinaryBitmap *image)

{
  bool bVar1;
  DecoderResult *this_00;
  long in_RSI;
  Result *in_RDI;
  DetectorResults detectorResult;
  BitMatrix *binImg;
  BinaryBitmap *in_stack_fffffffffffffe70;
  Result *this_01;
  undefined1 in_stack_ffffffffffffff15;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  BitMatrix *in_stack_ffffffffffffff18;
  BarcodeFormat in_stack_ffffffffffffff2c;
  DetectorResult *in_stack_ffffffffffffff30;
  DecoderResult *in_stack_ffffffffffffff38;
  Result *in_stack_ffffffffffffff40;
  BitMatrix *in_stack_ffffffffffffff98;
  DetectorResult local_60;
  BitMatrix *local_20;
  
  this_01 = in_RDI;
  local_20 = BinaryBitmap::getBitMatrix(in_stack_fffffffffffffe70);
  if (local_20 == (BitMatrix *)0x0) {
    memset(in_RDI,0,0xd8);
    Result::Result(this_01);
  }
  else {
    ReaderOptions::tryHarder(*(ReaderOptions **)(in_RSI + 8));
    ReaderOptions::tryRotate(*(ReaderOptions **)(in_RSI + 8));
    ReaderOptions::isPure(*(ReaderOptions **)(in_RSI + 8));
    Detect(in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17,(bool)in_stack_ffffffffffffff16
           ,(bool)in_stack_ffffffffffffff15);
    bVar1 = DetectorResult::isValid((DetectorResult *)0x27e19f);
    if (bVar1) {
      this_00 = (DecoderResult *)DetectorResult::bits(&local_60);
      Decode(in_stack_ffffffffffffff98);
      Result::Result(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff2c);
      DecoderResult::~DecoderResult(this_00);
    }
    else {
      in_RDI->_format = None;
      in_RDI->_ecLevel[0] = '\0';
      in_RDI->_ecLevel[1] = '\0';
      in_RDI->_ecLevel[2] = '\0';
      in_RDI->_ecLevel[3] = '\0';
      in_RDI->_version[0] = '\0';
      in_RDI->_version[1] = '\0';
      in_RDI->_version[2] = '\0';
      in_RDI->_version[3] = '\0';
      in_RDI->_lineCount = 0;
      (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
      *(undefined8 *)&(in_RDI->_sai).id = 0;
      (in_RDI->_sai).id._M_string_length = 0;
      *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
      (in_RDI->_sai).index = 0;
      (in_RDI->_sai).count = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
      *(undefined8 *)&in_RDI->_readerOpts = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
      (in_RDI->_error)._line = 0;
      (in_RDI->_error)._type = None;
      *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
      *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
      (in_RDI->_error)._file = (char *)0x0;
      (in_RDI->_error)._msg._M_string_length = 0;
      (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
      (in_RDI->_content).symbology.code = '\0';
      (in_RDI->_content).symbology.modifier = '\0';
      (in_RDI->_content).symbology.eciModifierOffset = '\0';
      (in_RDI->_content).symbology.aiFlag = None;
      (in_RDI->_content).defaultCharset = Unknown;
      (in_RDI->_content).hasECI = false;
      *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
      *(undefined8 *)&(in_RDI->_error)._msg = 0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      in_RDI->_isMirrored = false;
      in_RDI->_isInverted = false;
      in_RDI->_readerInit = false;
      *(undefined5 *)&in_RDI->field_0xd3 = 0;
      Result::Result(this_01);
    }
    DetectorResult::~DetectorResult((DetectorResult *)0x27e2c4);
  }
  return this_01;
}

Assistant:

Barcode Reader::decode(const BinaryBitmap& image) const
{
#ifdef __cpp_impl_coroutine
	return FirstOrDefault(decode(image, 1));
#else
	auto binImg = image.getBitMatrix();
	if (binImg == nullptr)
		return {};
	
	auto detectorResult = Detect(*binImg, _opts.tryHarder(), _opts.tryRotate(), _opts.isPure());
	if (!detectorResult.isValid())
		return {};

	return Barcode(Decode(detectorResult.bits()), std::move(detectorResult), BarcodeFormat::DataMatrix);
#endif
}